

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_char.c
# Opt level: O0

int bin_char_equal(char *vec1,char *vec2,int len)

{
  int i;
  int sum;
  int len_local;
  char *vec2_local;
  char *vec1_local;
  uint local_4;
  
  sum = 0;
  for (i = 0; i < len; i = i + 1) {
    sum = (char)(vec1[i] ^ vec2[i]) + sum;
  }
  local_4 = (uint)(sum == 0);
  return local_4;
}

Assistant:

int bin_char_equal(char *vec1, char *vec2, int len)
    {
        int sum=0;
        for(int i=0; i<len; i++)
            {
                sum+=vec1[i]^vec2[i];
                // printf("\n%i\n",sum);
            }
        if(sum==0) return 1;
        else return 0;
    }